

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manager.cpp
# Opt level: O2

void __thiscall SHOPManagement::Manager::display(Manager *this)

{
  ostream *poVar1;
  reference ppAVar2;
  size_type __n;
  ulong uVar3;
  ulong uVar4;
  string sStack_38;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"*** ");
  (*(this->super_Person).super_User._vptr_User[2])(&sStack_38,this);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  poVar1 = std::operator<<(poVar1," Information ***");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_38);
  poVar1 = std::operator<<((ostream *)&std::cout,"First Name: ");
  Person::getFirstName_abi_cxx11_(&sStack_38,&this->super_Person);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_38);
  poVar1 = std::operator<<((ostream *)&std::cout,"Last Name: ");
  Person::getLastName_abi_cxx11_(&sStack_38,&this->super_Person);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_38);
  poVar1 = std::operator<<((ostream *)&std::cout,"Phone Number: ");
  Person::getPhoneNumber_abi_cxx11_(&sStack_38,&this->super_Person);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_38);
  uVar3 = (ulong)((long)(this->super_Person).v_adress_list.
                        super__Vector_base<SHOPManagement::Address_*,_std::allocator<SHOPManagement::Address_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->super_Person).v_adress_list.
                       super__Vector_base<SHOPManagement::Address_*,_std::allocator<SHOPManagement::Address_*>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3;
  __n = 0;
  uVar4 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar4 = __n;
  }
  for (; uVar4 != __n; __n = __n + 1) {
    ppAVar2 = std::vector<SHOPManagement::Address_*,_std::allocator<SHOPManagement::Address_*>_>::at
                        (&(this->super_Person).v_adress_list,__n);
    (**(*ppAVar2)->_vptr_Address)();
  }
  return;
}

Assistant:

void Manager::display()
    {
        std::cout << "*** " << this->className() << " Information ***" << std::endl;
        std::cout << "First Name: " << this->getFirstName() << std::endl;
        std::cout << "Last Name: " << this->getLastName() << std::endl;
        std::cout << "Phone Number: " << this->getPhoneNumber() << std::endl;

        for (int i = 0, len = this->v_adress_list.size(); i < len; i++)
        {
            this->v_adress_list.at(i)->display();
        }
    }